

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  TestPartResult *pTVar3;
  ostream *poVar4;
  int line;
  char *pcVar5;
  TimeInMillis ms;
  _Alloc_hider _Var6;
  char *pcVar7;
  internal *this;
  int iVar8;
  int i;
  string location;
  string summary;
  allocator local_a9;
  ostream *local_a8;
  TestResult *local_a0;
  TestInfo *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string detail;
  string kTestsuite;
  
  std::__cxx11::string::string((string *)&kTestsuite,"testcase",(allocator *)&location);
  if (test_info->is_in_another_shard_ != false) goto LAB_0012d1d7;
  std::operator<<(stream,"    <testcase");
  std::__cxx11::string::string((string *)&location,"name",(allocator *)&detail);
  std::__cxx11::string::string
            ((string *)&summary,(test_info->name_)._M_dataplus._M_p,(allocator *)&local_90);
  OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  pbVar1 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string((string *)&location,"value_param",(allocator *)&detail);
    pbVar1 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var6._M_p = (char *)0x0;
    }
    else {
      _Var6._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&summary,_Var6._M_p,(allocator *)&local_90);
    OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
  }
  pbVar1 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string((string *)&location,"type_param",(allocator *)&detail);
    pbVar1 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var6._M_p = (char *)0x0;
    }
    else {
      _Var6._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&summary,_Var6._M_p,(allocator *)&local_90);
    OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    std::__cxx11::string::string((string *)&location,"file",(allocator *)&detail);
    std::__cxx11::string::string
              ((string *)&summary,(test_info->location_).file._M_dataplus._M_p,
               (allocator *)&local_90);
    OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
    std::__cxx11::string::string((string *)&location,"line",(allocator *)&local_90);
    detail._M_dataplus._M_p._0_4_ = (test_info->location_).line;
    StreamableToString<int>(&summary,(int *)&detail);
    OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
    std::__cxx11::string::~string((string *)&summary);
    std::__cxx11::string::~string((string *)&location);
    std::operator<<(stream," />\n");
    goto LAB_0012d1d7;
  }
  std::__cxx11::string::string((string *)&location,"status",(allocator *)&detail);
  local_a0 = &test_info->result_;
  bVar2 = TestResult::Skipped(local_a0);
  pcVar5 = "notrun";
  if ((test_info->should_run_ & 1U) != 0) {
    pcVar5 = "run";
  }
  pcVar7 = "skipped";
  if (!bVar2) {
    pcVar7 = pcVar5;
  }
  std::__cxx11::string::string((string *)&summary,pcVar7,(allocator *)&local_90);
  OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string((string *)&location,"time",(allocator *)&detail);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&summary,(internal *)(test_info->result_).elapsed_time_,ms)
  ;
  OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::string((string *)&location,"classname",(allocator *)&detail);
  std::__cxx11::string::string((string *)&summary,test_suite_name,(allocator *)&local_90);
  local_a8 = stream;
  local_98 = test_info;
  OutputXmlAttribute(stream,&kTestsuite,&location,&summary);
  std::__cxx11::string::~string((string *)&summary);
  std::__cxx11::string::~string((string *)&location);
  iVar8 = 0;
  i = 0;
  while( true ) {
    poVar4 = local_a8;
    line = 0x70;
    if ((int)(((long)(local_98->result_).test_part_results_.
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_98->result_).test_part_results_.
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= i) break;
    pTVar3 = TestResult::GetTestPartResult(local_a0,i);
    if (pTVar3->type_ - kNonFatalFailure < 2) {
      if (iVar8 == 0) {
        std::operator<<(local_a8,">\n");
      }
      this = (internal *)(pTVar3->file_name_)._M_string_length;
      if (this != (internal *)0x0) {
        this = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,this,(char *)(ulong)(uint)pTVar3->line_number_,line);
      std::operator+(&detail,&location,"\n");
      std::operator+(&summary,&detail,(pTVar3->summary_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&detail);
      poVar4 = std::operator<<(local_a8,"      <failure message=\"");
      std::__cxx11::string::string((string *)&local_90,summary._M_dataplus._M_p,&local_a9);
      EscapeXmlAttribute(&detail,&local_90);
      poVar4 = std::operator<<(poVar4,(string *)&detail);
      std::operator<<(poVar4,"\" type=\"\">");
      std::__cxx11::string::~string((string *)&detail);
      std::__cxx11::string::~string((string *)&local_90);
      std::operator+(&local_90,&location,"\n");
      std::operator+(&detail,&local_90,(pTVar3->message_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_90);
      RemoveInvalidXmlCharacters(&local_90,&detail);
      poVar4 = local_a8;
      OutputXmlCDataSection(local_a8,local_90._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_90);
      std::operator<<(poVar4,"</failure>\n");
      iVar8 = iVar8 + 1;
      std::__cxx11::string::~string((string *)&detail);
      std::__cxx11::string::~string((string *)&summary);
      std::__cxx11::string::~string((string *)&location);
    }
    i = i + 1;
  }
  if (iVar8 == 0) {
    if ((int)((ulong)((long)(local_98->result_).test_properties_.
                            super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_98->result_).test_properties_.
                           super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) != 0) {
      std::operator<<(local_a8,">\n");
      goto LAB_0012d1bb;
    }
    pcVar5 = " />\n";
  }
  else {
LAB_0012d1bb:
    OutputXmlTestProperties(poVar4,local_a0);
    pcVar5 = "    </testcase>\n";
  }
  std::operator<<(poVar4,pcVar5);
LAB_0012d1d7:
  std::__cxx11::string::~string((string *)&kTestsuite);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_suite_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestsuite, "name", test_info.name());

  if (test_info.value_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "type_param",
                       test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "file", test_info.file());
    OutputXmlAttribute(stream, kTestsuite, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(
      stream, kTestsuite, "status",
      result.Skipped() ? "skipped" : test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestsuite, "classname", test_suite_name);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}